

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boundary.cpp
# Opt level: O2

index_type *
booster::locale::boundary::impl_icu::map_direct
          (index_type *__return_storage_ptr__,boundary_type t,BreakIterator *it,int reserve)

{
  rule_type *prVar1;
  pointer pbVar2;
  pointer piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int32_t *piVar9;
  UErrorCode err;
  value_type_conflict1 local_7c;
  vector<int,_std::allocator<int>_> buffer;
  int32_t membuf [8];
  
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::reserve(__return_storage_ptr__,(long)reserve);
  membuf[0] = 0;
  membuf[1] = 0;
  membuf._8_8_ = (ulong)(uint)membuf[3] << 0x20;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::emplace_back<booster::locale::boundary::break_info>(__return_storage_ptr__,(break_info *)membuf)
  ;
  (**(code **)(*(long *)it + 0x50))(it);
  do {
    while( true ) {
      iVar4 = (**(code **)(*(long *)it + 0x68))(it);
      if (iVar4 == -1) {
        return __return_storage_ptr__;
      }
      membuf._0_8_ = SEXT48(iVar4);
      membuf._8_8_ = membuf._8_8_ & 0xffffffff00000000;
      std::
      vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
      ::emplace_back<booster::locale::boundary::break_info>
                (__return_storage_ptr__,(break_info *)membuf);
      if (t != character) break;
      prVar1 = &(__return_storage_ptr__->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_finish[-1].rule;
      *prVar1 = *prVar1 | 0xf;
    }
    buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    membuf[4] = 0;
    membuf[5] = 0;
    membuf[6] = 0;
    membuf[7] = 0;
    membuf[0] = 0;
    membuf[1] = 0;
    membuf[2] = 0;
    membuf[3] = 0;
    err = U_ZERO_ERROR;
    uVar5 = (**(code **)(*(long *)it + 0xa0))(it,membuf,8,&err);
    piVar3 = buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = membuf;
    if (err == U_BUFFER_OVERFLOW_ERROR) {
      local_7c = 0;
      std::vector<int,_std::allocator<int>_>::resize(&buffer,(long)(int)uVar5,&local_7c);
      uVar5 = (**(code **)(*(long *)it + 0xa0))
                        (it,piVar3,
                         (ulong)((long)buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)buffer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2,&err);
      piVar9 = piVar3;
    }
    locale::impl_icu::check_and_throw_icu_error(err);
    pbVar2 = (__return_storage_ptr__->
             super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar7 = 0xf;
      if (t == line) {
        uVar8 = piVar9[uVar6];
joined_r0x0018d0b1:
        if (uVar8 < 100) goto LAB_0018d0c0;
        uVar8 = uVar8 - 100;
        uVar7 = 0xf0;
joined_r0x0018d0be:
        if (uVar8 < 100) goto LAB_0018d0c0;
      }
      else {
        if (t == sentence) {
          uVar8 = piVar9[uVar6];
          goto joined_r0x0018d0b1;
        }
        if (t != word) goto LAB_0018d0c3;
        uVar8 = piVar9[uVar6];
        if ((((99 < uVar8) && (uVar7 = 0xf0, 99 < uVar8 - 100)) && (uVar7 = 0xf00, 99 < uVar8 - 200)
            ) && (uVar7 = 0xf000, 99 < uVar8 - 300)) {
          uVar8 = uVar8 - 400;
          uVar7 = 0xf0000;
          goto joined_r0x0018d0be;
        }
LAB_0018d0c0:
        prVar1 = &pbVar2[-1].rule;
        *prVar1 = *prVar1 | uVar7;
      }
LAB_0018d0c3:
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&buffer.super__Vector_base<int,_std::allocator<int>_>);
  } while( true );
}

Assistant:

index_type map_direct(boundary_type t,icu::BreakIterator *it,int reserve)
{
    index_type indx;
    indx.reserve(reserve);
#if U_ICU_VERSION_MAJOR_NUM >= 52
    icu::BreakIterator *rbbi=it;
#else
    icu::RuleBasedBreakIterator *rbbi=dynamic_cast<icu::RuleBasedBreakIterator *>(it);
#endif
    
    indx.push_back(break_info());
    it->first();
    int pos=0;
    while((pos=it->next())!=icu::BreakIterator::DONE) {
        indx.push_back(break_info(pos));
        /// Character does not have any specific break types
        if(t!=character && rbbi) {
            //
            // There is a collapse for MSVC: int32_t defined by both boost::cstdint and icu...
            // So need to pick one ;(
            //
            std::vector< ::int32_t> buffer;
            ::int32_t membuf[8]={0}; // try not to use memory allocation if possible
            ::int32_t *buf=membuf;

            UErrorCode err=U_ZERO_ERROR;
            int n = rbbi->getRuleStatusVec(buf,8,err);
            
            if(err == U_BUFFER_OVERFLOW_ERROR) {
                buf=&buffer.front();
                buffer.resize(n,0);
                n = rbbi->getRuleStatusVec(buf,buffer.size(),err);
            }

            check_and_throw_icu_error(err);

            for(int i=0;i<n;i++) {
                switch(t) {
                case word:
                    if(UBRK_WORD_NONE<=buf[i] && buf[i]<UBRK_WORD_NONE_LIMIT)
                        indx.back().rule |= word_none;
                    else if(UBRK_WORD_NUMBER<=buf[i] && buf[i]<UBRK_WORD_NUMBER_LIMIT)
                        indx.back().rule |= word_number;
                    else if(UBRK_WORD_LETTER<=buf[i] && buf[i]<UBRK_WORD_LETTER_LIMIT)
                        indx.back().rule |= word_letter;
                    else if(UBRK_WORD_KANA<=buf[i] && buf[i]<UBRK_WORD_KANA_LIMIT)
                        indx.back().rule |= word_kana;
                    else if(UBRK_WORD_IDEO<=buf[i] && buf[i]<UBRK_WORD_IDEO_LIMIT)
                        indx.back().rule |= word_ideo;
                    break;

                case line:
                    if(UBRK_LINE_SOFT<=buf[i] && buf[i]<UBRK_LINE_SOFT_LIMIT)
                        indx.back().rule |= line_soft;
                    else if(UBRK_LINE_HARD<=buf[i] && buf[i]<UBRK_LINE_HARD_LIMIT)
                        indx.back().rule |= line_hard;
                    break;

                case sentence:
                    if(UBRK_SENTENCE_TERM<=buf[i] && buf[i]<UBRK_SENTENCE_TERM_LIMIT)
                        indx.back().rule |= sentence_term;
                    else if(UBRK_SENTENCE_SEP<=buf[i] && buf[i]<UBRK_SENTENCE_SEP_LIMIT)
                        indx.back().rule |= sentence_sep;
                    break;
                default:
                    ;
                }
            }
        }
        else {
            indx.back().rule |=character_any; // Baisc mark... for character
        }
    }
    return indx;
}